

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O3

int read_quoted(void)

{
  bool bVar1;
  int iVar2;
  int x;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = fgetc((FILE *)fin);
  if (iVar2 < 0x66) {
    if (iVar2 == 10) {
      lineno = lineno + 1;
      return -1;
    }
    if (iVar2 == 0x61) {
      return 7;
    }
    if (iVar2 == 0x62) {
      return 8;
    }
    goto switchD_001980f9_caseD_6f;
  }
  switch(iVar2) {
  case 0x6e:
    iVar2 = 10;
    break;
  case 0x72:
    iVar2 = 0xd;
    break;
  case 0x74:
    iVar2 = 9;
    break;
  case 0x76:
    iVar2 = 0xb;
    break;
  case 0x78:
    iVar2 = 0;
    iVar3 = 3;
    do {
      x = fgetc((FILE *)fin);
      iVar4 = hexdigit(x);
      if (0xf < iVar4) goto LAB_001981ca;
      iVar2 = iVar2 * 0x10 + iVar4;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    break;
  default:
    if (iVar2 == 0x66) {
      return 0xc;
    }
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
switchD_001980f9_caseD_6f:
    if (0xfffffff7 < iVar2 - 0x38U) {
      iVar2 = iVar2 + -0x30;
      bVar1 = true;
      do {
        bVar5 = bVar1;
        x = fgetc((FILE *)fin);
        iVar3 = hexdigit(x);
        if (7 < iVar3) {
LAB_001981ca:
          ungetc(x,(FILE *)fin);
          return iVar2;
        }
        iVar2 = iVar3 + iVar2 * 8;
        bVar1 = false;
      } while (bVar5);
    }
  }
  return iVar2;
}

Assistant:

static int read_quoted() {	// read whatever character is after a \ .
  int c,d,x;
  switch(c = fgetc(fin)) {
  case '\n': lineno++; return -1;
  case 'a' : return('\a');
  case 'b' : return('\b');
  case 'f' : return('\f');
  case 'n' : return('\n');
  case 'r' : return('\r');
  case 't' : return('\t');
  case 'v' : return('\v');
  case 'x' :	/* read hex */
    for (c=x=0; x<3; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d > 15) {ungetc(ch,fin); break;}
      c = (c<<4)+d;
    }
    break;
  default:		/* read octal */
    if (c<'0' || c>'7') break;
    c -= '0';
    for (x=0; x<2; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d>7) {ungetc(ch,fin); break;}
      c = (c<<3)+d;
    }
    break;
  }
  return(c);
}